

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O3

INT16 MemoryCopy2B(TPM2B *dest,TPM2B *source,uint dSize)

{
  UINT16 UVar1;
  
  if (dest != (TPM2B *)0x0) {
    if ((source == (TPM2B *)0x0) || (dSize < source->size)) {
      UVar1 = 0;
    }
    else {
      memmove(dest->buffer,source->buffer,(ulong)source->size);
      UVar1 = source->size;
    }
    dest->size = UVar1;
    return UVar1;
  }
  return 0;
}

Assistant:

INT16 MemoryCopy2B(TPM2B* dest, const TPM2B* source, unsigned int dSize)
{
    INT16 result;
    if (dest == NULL)
    {
        result = 0;
    }
    else
    {
        if (source == NULL)
        {
            dest->size = 0;
        }
        else if (source->size > dSize)
        {
            dest->size = 0;
        }
        else
        {
            //pAssert(source->size <= dSize);
            MemoryCopy(dest->buffer, source->buffer, source->size);
            dest->size = source->size;
        }
        result = dest->size;
    }
    return result;
}